

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brecovery.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char **args;
  Session *pSVar1;
  long lVar2;
  atomic<unsigned_long> aVar3;
  unsigned_long uVar4;
  bool bVar5;
  cx_string<2UL> cVar6;
  cx_string<4UL> cVar7;
  SessionWriter *pSVar8;
  __atomic_base<unsigned_long> _Var9;
  nanoseconds nVar10;
  code *pcVar11;
  long *plVar12;
  size_t sVar13;
  uint64_t uVar14;
  size_t sVar15;
  ulong uVar16;
  int iVar17;
  string *this;
  pointer pRVar18;
  char *pcVar19;
  EventSource *in_R9;
  pointer pRVar20;
  __normal_iterator<RecoveredBuffer_*,_std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>_>
  __i;
  long lVar21;
  pointer pRVar22;
  allocator local_13e2;
  allocator local_13e1;
  undefined2 local_13e0;
  char local_13de;
  allocator local_13da;
  allocator local_13d9;
  size_t size;
  const_iterator cStack_13d0;
  pointer local_13c8;
  QueueReader reader;
  uintptr_t session;
  unsigned_long uStack_13a0;
  unsigned_long local_1398;
  pointer pcStack_1390;
  __atomic_base<unsigned_long> local_1388;
  uintptr_t session_1;
  allocator local_1369;
  void *sessionptr_1;
  streamoff afterMagicPos;
  pointer local_1358;
  array<unsigned_char,_8UL> local_1350;
  vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> buffers;
  vector<char,_std::allocator<char>_> queueBuffer;
  string local_12c8 [32];
  string local_12a8 [32];
  uint64_t local_1288;
  string local_1280 [32];
  string local_1260 [32];
  undefined1 local_1240 [16];
  undefined1 local_1230 [32];
  string local_1210 [32];
  string local_11f0 [32];
  uint64_t local_11d0;
  string local_11c8 [32];
  string local_11a8 [32];
  undefined1 *local_1188;
  string *local_1180;
  string *local_1178;
  string *local_1170;
  string *local_1168;
  string *local_1160;
  array<unsigned_char,_8UL> dataMagic;
  array<unsigned_char,_8UL> metadataMagic;
  vector<char,_std::allocator<char>_> metadata;
  undefined1 local_10b0 [32];
  undefined1 local_1090 [16];
  undefined1 local_1080 [32];
  string local_1060 [32];
  string local_1040 [32];
  uint64_t local_1020;
  string local_1018 [32];
  string local_ff8 [32];
  size_t offset;
  Severity local_fd0;
  undefined6 uStack_fce;
  _Alloc_hider local_fc8;
  size_type local_fc0;
  string local_fa8 [32];
  string local_f88 [32];
  uint64_t local_f68;
  string local_f60 [32];
  string local_f40 [32];
  undefined1 local_f20 [48];
  string local_ef0 [32];
  string local_ed0 [32];
  uint64_t local_eb0;
  string local_ea8 [32];
  string local_e88 [32];
  string outputPath;
  void *sessionptr;
  Severity local_e40;
  string local_e38 [32];
  string local_e18 [32];
  string local_df8 [32];
  uint64_t local_dd8;
  string local_dd0 [32];
  string local_db0 [32];
  undefined1 local_d90 [48];
  string local_d60 [32];
  string local_d40 [32];
  uint64_t local_d20;
  string local_d18 [32];
  string local_cf8 [32];
  undefined1 local_cd8 [48];
  string local_ca8 [32];
  string local_c88 [32];
  uint64_t local_c68;
  string local_c60 [32];
  string asStack_c40 [32];
  undefined1 local_c20 [48];
  string local_bf0 [32];
  string local_bd0 [32];
  uint64_t local_bb0;
  string local_ba8 [32];
  string asStack_b88 [32];
  undefined1 local_b68 [48];
  string local_b38 [32];
  string local_b18 [32];
  uint64_t local_af8;
  string local_af0 [32];
  string asStack_ad0 [32];
  undefined1 local_ab0 [48];
  string local_a80 [32];
  string local_a60 [32];
  uint64_t local_a40;
  string local_a38 [32];
  string asStack_a18 [32];
  undefined1 local_9f8 [48];
  string local_9c8 [32];
  string local_9a8 [32];
  uint64_t local_988;
  string local_980 [32];
  string local_960 [32];
  undefined1 local_940 [48];
  string local_910 [32];
  string local_8f0 [32];
  uint64_t local_8d0;
  string local_8c8 [32];
  string local_8a8 [32];
  undefined1 local_888 [48];
  string local_858 [32];
  string local_838 [32];
  uint64_t local_818;
  string local_810 [32];
  string local_7f0 [32];
  undefined1 local_7d0 [48];
  string local_7a0 [32];
  string local_780 [32];
  uint64_t local_760;
  string local_758 [32];
  string local_738 [32];
  undefined1 local_718 [48];
  string local_6e8 [32];
  string local_6c8 [32];
  uint64_t local_6a8;
  string local_6a0 [32];
  string local_680 [32];
  undefined1 local_660 [48];
  string local_630 [32];
  string local_610 [32];
  uint64_t local_5f0;
  string local_5e8 [32];
  string local_5c8 [32];
  undefined1 local_5a8 [48];
  string local_578 [32];
  string local_558 [32];
  uint64_t local_538;
  string local_530 [32];
  string local_510 [32];
  undefined1 local_4f0 [48];
  string local_4c0 [32];
  string local_4a0 [32];
  uint64_t local_480;
  string local_478 [32];
  string local_458 [32];
  ifstream input;
  byte abStack_418 [488];
  ofstream outputFile;
  undefined1 local_210 [480];
  
  if (argc < 2) {
    anon_unknown.dwarf_111fd::showHelp();
    return 1;
  }
  args = argv + 1;
  std::ifstream::ifstream((istream *)&input,argv[1],_S_in|_S_bin);
  if ((abStack_418[*(long *)(_input + -0x18)] & 5) != 0) {
    pSVar8 = binlog::default_thread_local_writer();
    if ((pSVar8->_session->_minSeverity)._M_i < 0x201) {
      if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
        pSVar8 = binlog::default_thread_local_writer();
        pSVar1 = pSVar8->_session;
        local_4f0._0_8_ = 0;
        local_4f0._8_2_ = error;
        std::__cxx11::string::string((string *)(local_4f0 + 0x10),"main",(allocator *)local_1240);
        std::__cxx11::string::string(local_4c0,"main",(allocator *)&offset);
        std::__cxx11::string::string
                  (local_4a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,(allocator *)&queueBuffer);
        local_480 = 0xfe;
        std::__cxx11::string::string
                  (local_478,"Failed to open {} for reading",(allocator *)local_f20);
        cVar6 = binlog::detail::concatenated_tags<char_const(&)[30],char_const*&>
                          ((char (*) [30])"Failed to open {} for reading",args);
        _outputFile = cVar6._data._0_2_;
        std::__cxx11::string::string(local_458,(char *)&outputFile,(allocator *)local_1090);
        _Var9._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_4f0);
        binlog::EventSource::~EventSource((EventSource *)local_4f0);
        LOCK();
        UNLOCK();
        main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var9._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
      pSVar8 = binlog::default_thread_local_writer();
      nVar10 = binlog::clockSinceEpoch();
      binlog::SessionWriter::addEvent<char_const*&>
                (pSVar8,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,nVar10.__r,args);
    }
    anon_unknown.dwarf_111fd::printLogs();
    anon_unknown.dwarf_111fd::showHelp();
    iVar17 = 2;
    goto LAB_00105b68;
  }
  if (argc == 2) {
    pcVar19 = "-";
  }
  else {
    pcVar19 = argv[2];
  }
  std::__cxx11::string::string((string *)&outputPath,pcVar19,(allocator *)&outputFile);
  this = (string *)&outputFile;
  std::ofstream::ofstream(this);
  bVar5 = std::operator==(&outputPath,"-");
  if (bVar5) {
    this = (string *)&std::cout;
    pcVar11 = std::__cxx11::string::string;
  }
  else {
    std::ofstream::open(this,(_Ios_Openmode)&outputPath);
    pcVar11 = (code *)local_210;
  }
  if (((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 5) == 0) {
    buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    metadataMagic._M_elems[0] = 0xbc;
    metadataMagic._M_elems[1] = 0xbd;
    metadataMagic._M_elems[2] = '5';
    metadataMagic._M_elems[3] = 'n';
    metadataMagic._M_elems[4] = 'r';
    metadataMagic._M_elems[5] = 'O';
    metadataMagic._M_elems[6] = '!';
    metadataMagic._M_elems[7] = 0xfe;
    dataMagic._M_elems[0] = 0xbc;
    dataMagic._M_elems[1] = 0xbc;
    dataMagic._M_elems[2] = '4';
    dataMagic._M_elems[3] = 'm';
    dataMagic._M_elems[4] = 'q';
    dataMagic._M_elems[5] = '?';
    dataMagic._M_elems[6] = '!';
    dataMagic._M_elems[7] = 0xfe;
    pSVar8 = binlog::default_thread_local_writer();
    if ((pSVar8->_session->_minSeverity)._M_i < 0x81) {
      if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
        pSVar8 = binlog::default_thread_local_writer();
        pSVar1 = pSVar8->_session;
        local_9f8._0_8_ = 0;
        local_9f8._8_2_ = info;
        std::__cxx11::string::string((string *)(local_9f8 + 0x10),"main",(allocator *)&offset);
        std::__cxx11::string::string(local_9c8,"main",(allocator *)&queueBuffer);
        std::__cxx11::string::string
                  (local_9a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,(allocator *)local_f20);
        local_988 = 0x117;
        std::__cxx11::string::string(local_980,"Read input from {}",(allocator *)local_1090);
        cVar6 = binlog::detail::concatenated_tags<char_const(&)[19],char_const*&>
                          ((char (*) [19])"Read input from {}",args);
        local_1240[0] = cVar6._data[0];
        local_1240[1] = cVar6._data[1];
        local_1240[2] = cVar6._data[2];
        std::__cxx11::string::string(local_960,local_1240,(allocator *)&metadata);
        _Var9._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_9f8);
        binlog::EventSource::~EventSource((EventSource *)local_9f8);
        LOCK();
        UNLOCK();
        main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var9._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
      pSVar8 = binlog::default_thread_local_writer();
      nVar10 = binlog::clockSinceEpoch();
      binlog::SessionWriter::addEvent<char_const*&>
                (pSVar8,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,nVar10.__r,args);
    }
    anon_unknown.dwarf_111fd::printLogs();
    local_1168 = asStack_b88;
    local_1188 = local_10b0;
    local_1180 = local_db0;
    local_1178 = local_ff8;
    local_1170 = asStack_c40;
    local_1358 = (pointer)asStack_a18;
    local_1160 = asStack_ad0;
LAB_00103bb0:
    do {
      plVar12 = (long *)std::istream::ignore((long)&input,-1);
      if (*(int *)((long)plVar12 + *(long *)(*plVar12 + -0x18) + 0x20) != 0) goto LAB_001052e0;
      local_1350._M_elems[0] = 0xbc;
      local_1350._M_elems[5] = '\0';
      local_1350._M_elems[6] = '\0';
      local_1350._M_elems[7] = '\0';
      local_1350._M_elems[1] = '\0';
      local_1350._M_elems[2] = '\0';
      local_1350._M_elems[3] = '\0';
      local_1350._M_elems[4] = '\0';
      std::istream::read((char *)&input,(long)(local_1350._M_elems + 1));
      afterMagicPos = std::istream::tellg();
      bVar5 = std::operator==(&local_1350,&metadataMagic);
      if (bVar5) {
        pSVar8 = binlog::default_thread_local_writer();
        if ((pSVar8->_session->_minSeverity)._M_i < 0x81) {
          if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
            pSVar8 = binlog::default_thread_local_writer();
            pSVar1 = pSVar8->_session;
            local_ab0._0_8_ = 0;
            local_ab0._8_2_ = info;
            std::__cxx11::string::string((string *)(local_ab0 + 0x10),"main",(allocator *)&offset);
            std::__cxx11::string::string(local_a80,"main",(allocator *)&queueBuffer);
            std::__cxx11::string::string
                      (local_a60,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,(allocator *)local_f20);
            local_a40 = 0x122;
            std::__cxx11::string::string
                      (local_a38,"Magic number found, read metadata at tellg={}",
                       (allocator *)local_1090);
            local_1240._0_2_ = 0x6c;
            std::__cxx11::string::string
                      ((string *)local_1358,(char *)local_1240,(allocator *)&metadata);
            _Var9._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_ab0);
            binlog::EventSource::~EventSource((EventSource *)local_ab0);
            LOCK();
            UNLOCK();
            main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var9._M_i;
          }
          aVar3.super___atomic_base<unsigned_long>._M_i =
               main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
          pSVar8 = binlog::default_thread_local_writer();
          nVar10 = binlog::clockSinceEpoch();
          binlog::SessionWriter::addEvent<long_const&>
                    (pSVar8,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,nVar10.__r,
                     &afterMagicPos);
        }
        anon_unknown.dwarf_111fd::printLogs();
        sessionptr = (void *)0x0;
        std::istream::read((char *)&input,(long)&sessionptr);
        session = (uintptr_t)sessionptr;
        size = 0;
        std::istream::read((char *)&input,(long)&size);
        sVar15 = size;
        sVar13 = anon_unknown.dwarf_111fd::remainingSize((istream *)&input);
        if (sVar13 < sVar15) {
          pSVar8 = binlog::default_thread_local_writer();
          if ((pSVar8->_session->_minSeverity)._M_i < 0x201) {
            if (_ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0
                == 0) {
              pSVar8 = binlog::default_thread_local_writer();
              pSVar1 = pSVar8->_session;
              local_1240._0_8_ = 0;
              local_1240._8_2_ = 0x200;
              std::__cxx11::string::string((string *)local_1230,"main",(allocator *)&metadata);
              std::__cxx11::string::string(local_1210,"readMetadata",(allocator *)&reader);
              std::__cxx11::string::string
                        (local_11f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,(allocator *)&sessionptr_1);
              local_11d0 = 0x82;
              std::__cxx11::string::string
                        (local_11c8,"  Input doesn\'t have {} bytes",(allocator *)&session_1);
              local_1090._0_2_ = 0x4c;
              std::__cxx11::string::string(local_11a8,local_1090,(allocator *)&local_13e0);
              uVar14 = binlog::Session::addEventSource(pSVar1,(EventSource *)local_1240);
              binlog::EventSource::~EventSource((EventSource *)local_1240);
              LOCK();
              UNLOCK();
              _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0
                   = uVar14;
            }
            uVar14 = 
            _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0
            ;
            pSVar8 = binlog::default_thread_local_writer();
            nVar10 = binlog::clockSinceEpoch();
            binlog::SessionWriter::addEvent<unsigned_long&>(pSVar8,uVar14,nVar10.__r,&size);
          }
          anon_unknown.dwarf_111fd::printLogs();
        }
        else {
          metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          std::vector<char,_std::allocator<char>_>::resize(&metadata,size);
          std::istream::read((char *)&input,
                             (long)metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start);
          if ((abStack_418[*(long *)(_input + -0x18)] & 5) == 0) {
            bVar5 = anon_unknown.dwarf_111fd::checkEntryBuffer(&metadata);
            if (bVar5) {
              pSVar8 = binlog::default_thread_local_writer();
              if ((pSVar8->_session->_minSeverity)._M_i < 0x81) {
                if (_ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_2_0
                    == 0) {
                  pSVar8 = binlog::default_thread_local_writer();
                  pSVar1 = pSVar8->_session;
                  local_f20._0_8_ = 0;
                  local_f20._8_2_ = info;
                  std::__cxx11::string::string
                            ((string *)(local_f20 + 0x10),"main",(allocator *)&sessionptr_1);
                  std::__cxx11::string::string(local_ef0,"readMetadata",(allocator *)&session_1);
                  std::__cxx11::string::string
                            (local_ed0,
                             "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                             ,(allocator *)&local_13e0);
                  local_eb0 = 0x9a;
                  std::__cxx11::string::string
                            (local_ea8,"  Recovered {} bytes of metadata from session={}",
                             &local_13e2);
                  local_1090._0_8_ =
                       (long)metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start;
                  cVar6 = binlog::detail::
                          concatenated_tags<char_const(&)[49],unsigned_long,unsigned_long_const&>
                                    ((char (*) [49])
                                     "  Recovered {} bytes of metadata from session={}",
                                     (unsigned_long *)local_1090,&session);
                  reader._queue = (Queue *)CONCAT53(reader._queue._3_5_,cVar6._data);
                  std::__cxx11::string::string(local_e88,(char *)&reader,&local_13e1);
                  uVar14 = binlog::Session::addEventSource(pSVar1,(EventSource *)local_f20);
                  binlog::EventSource::~EventSource((EventSource *)local_f20);
                  LOCK();
                  UNLOCK();
                  _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_2_0
                       = uVar14;
                }
                uVar14 = 
                _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_2_0
                ;
                pSVar8 = binlog::default_thread_local_writer();
                nVar10 = binlog::clockSinceEpoch();
                local_1090._0_8_ =
                     (long)metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
                binlog::SessionWriter::addEvent<unsigned_long,unsigned_long_const&>
                          (pSVar8,uVar14,nVar10.__r,(unsigned_long *)local_1090,&session);
              }
              anon_unknown.dwarf_111fd::printLogs();
              local_1090._0_8_ = local_1090._0_8_ & 0xffffffff00000000;
              local_1090._8_8_ = session;
              local_1080._0_8_ =
                   metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_1080._8_8_ =
                   metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_1080._16_8_ =
                   metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::
              emplace_back<RecoveredBuffer>(&buffers,(RecoveredBuffer *)local_1090);
              std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                        ((_Vector_base<char,_std::allocator<char>_> *)local_1080);
              std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                        (&metadata.super__Vector_base<char,_std::allocator<char>_>);
              goto LAB_00103bb0;
            }
          }
          else {
            pSVar8 = binlog::default_thread_local_writer();
            if ((pSVar8->_session->_minSeverity)._M_i < 0x201) {
              if (_ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_1_0
                  == 0) {
                pSVar8 = binlog::default_thread_local_writer();
                pSVar1 = pSVar8->_session;
                queueBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                queueBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)CONCAT62(queueBuffer.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._2_6_,0x200);
                std::__cxx11::string::string
                          ((string *)
                           &queueBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,"main",(allocator *)&reader);
                std::__cxx11::string::string(local_12c8,"readMetadata",(allocator *)&sessionptr_1);
                std::__cxx11::string::string
                          (local_12a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                           ,(allocator *)&session_1);
                local_1288 = 0x94;
                std::__cxx11::string::string
                          (local_1280,"  Failed to read {} bytes of metadata from input",
                           (allocator *)&local_13e0);
                local_1090._0_2_ = 0x4c;
                std::__cxx11::string::string(local_1260,local_1090,&local_13e2);
                uVar14 = binlog::Session::addEventSource(pSVar1,(EventSource *)&queueBuffer);
                binlog::EventSource::~EventSource((EventSource *)&queueBuffer);
                LOCK();
                UNLOCK();
                _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_1_0
                     = uVar14;
              }
              uVar14 = 
              _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_1_0
              ;
              pSVar8 = binlog::default_thread_local_writer();
              nVar10 = binlog::clockSinceEpoch();
              binlog::SessionWriter::addEvent<unsigned_long&>(pSVar8,uVar14,nVar10.__r,&size);
            }
            anon_unknown.dwarf_111fd::printLogs();
          }
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&metadata.super__Vector_base<char,_std::allocator<char>_>);
        }
        pSVar8 = binlog::default_thread_local_writer();
        if ((pSVar8->_session->_minSeverity)._M_i < 0x201) {
          if (main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i == 0) {
            pSVar8 = binlog::default_thread_local_writer();
            pSVar1 = pSVar8->_session;
            local_b68._0_8_ = 0;
            local_b68._8_2_ = error;
            std::__cxx11::string::string((string *)(local_b68 + 0x10),"main",(allocator *)&offset);
            std::__cxx11::string::string(local_b38,"main",(allocator *)&queueBuffer);
            std::__cxx11::string::string
                      (local_b18,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,(allocator *)local_f20);
            local_af8 = 0x125;
            std::__cxx11::string::string
                      (local_af0,"  Failed to read metadata, continue searching at tellg={}",
                       (allocator *)local_1090);
            local_1240._0_2_ = 0x6c;
            std::__cxx11::string::string(local_1160,(char *)local_1240,(allocator *)&metadata);
            _Var9._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_b68);
            binlog::EventSource::~EventSource((EventSource *)local_b68);
            LOCK();
            UNLOCK();
            main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var9._M_i;
          }
          aVar3.super___atomic_base<unsigned_long>._M_i =
               main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i;
          pSVar8 = binlog::default_thread_local_writer();
          nVar10 = binlog::clockSinceEpoch();
          binlog::SessionWriter::addEvent<long_const&>
                    (pSVar8,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,nVar10.__r,
                     &afterMagicPos);
        }
        anon_unknown.dwarf_111fd::printLogs();
LAB_001052b3:
        std::ios::clear((int)*(undefined8 *)(_input + -0x18) + (int)(istream *)&input);
        std::istream::seekg((istream *)&input,afterMagicPos,0);
        goto LAB_00103bb0;
      }
      bVar5 = std::operator==(&local_1350,&dataMagic);
      if (bVar5) {
        pSVar8 = binlog::default_thread_local_writer();
        if ((pSVar8->_session->_minSeverity)._M_i < 0x81) {
          if (main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i == 0) {
            pSVar8 = binlog::default_thread_local_writer();
            pSVar1 = pSVar8->_session;
            local_c20._0_8_ = 0;
            local_c20._8_2_ = info;
            std::__cxx11::string::string((string *)(local_c20 + 0x10),"main",(allocator *)&offset);
            std::__cxx11::string::string(local_bf0,"main",(allocator *)&queueBuffer);
            std::__cxx11::string::string
                      (local_bd0,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,(allocator *)local_f20);
            local_bb0 = 300;
            std::__cxx11::string::string
                      (local_ba8,"Magic number found, read data at tellg={}",(allocator *)local_1090
                      );
            local_1240._0_2_ = 0x6c;
            std::__cxx11::string::string(local_1168,(char *)local_1240,(allocator *)&metadata);
            _Var9._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_c20);
            binlog::EventSource::~EventSource((EventSource *)local_c20);
            LOCK();
            UNLOCK();
            main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var9._M_i;
          }
          aVar3.super___atomic_base<unsigned_long>._M_i =
               main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i;
          pSVar8 = binlog::default_thread_local_writer();
          nVar10 = binlog::clockSinceEpoch();
          binlog::SessionWriter::addEvent<long_const&>
                    (pSVar8,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,nVar10.__r,
                     &afterMagicPos);
        }
        anon_unknown.dwarf_111fd::printLogs();
        sessionptr_1 = (void *)0x0;
        std::istream::read((char *)&input,(long)&sessionptr_1);
        session_1 = (uintptr_t)sessionptr_1;
        local_1398 = 0;
        pcStack_1390 = (pointer)0x0;
        session = 0;
        uStack_13a0 = 0;
        local_1388._M_i = 0;
        std::istream::read((char *)&input,(long)&session);
        if (local_1398 < session) {
          pSVar8 = binlog::default_thread_local_writer();
          if ((pSVar8->_session->_minSeverity)._M_i < 0x201) {
            if (_ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_0 ==
                0) {
              pSVar8 = binlog::default_thread_local_writer();
              pSVar1 = pSVar8->_session;
              local_1240._0_8_ = 0;
              local_1240._8_2_ = 0x200;
              std::__cxx11::string::string((string *)local_1230,"main",(allocator *)&local_13e0);
              std::__cxx11::string::string(local_1210,"checkQueueInvariants",&local_13e2);
              std::__cxx11::string::string
                        (local_11f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,&local_13e1);
              local_11d0 = 0xa4;
              std::__cxx11::string::string
                        (local_11c8,"  Queue invariant violated: writer={} > capacity={}",
                         &local_13da);
              size = session;
              cVar6 = binlog::detail::
                      concatenated_tags<char_const(&)[52],unsigned_long,unsigned_long&>
                                ((char (*) [52])
                                 "  Queue invariant violated: writer={} > capacity={}",&size,
                                 &local_1398);
              reader._queue = (Queue *)CONCAT53(reader._queue._3_5_,cVar6._data);
              std::__cxx11::string::string(local_11a8,(char *)&reader,&local_13d9);
              uVar14 = binlog::Session::addEventSource(pSVar1,(EventSource *)local_1240);
              binlog::EventSource::~EventSource((EventSource *)local_1240);
              LOCK();
              UNLOCK();
              _ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_0 =
                   uVar14;
            }
            uVar14 = 
            _ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_0;
            pSVar8 = binlog::default_thread_local_writer();
            nVar10 = binlog::clockSinceEpoch();
            size = session;
LAB_001041ab:
            binlog::SessionWriter::addEvent<unsigned_long,unsigned_long&>
                      (pSVar8,uVar14,nVar10.__r,&size,&local_1398);
          }
        }
        else if (local_1398 < uStack_13a0) {
          pSVar8 = binlog::default_thread_local_writer();
          if ((pSVar8->_session->_minSeverity)._M_i < 0x201) {
            if (_ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_0_0
                == 0) {
              pSVar8 = binlog::default_thread_local_writer();
              pSVar1 = pSVar8->_session;
              offset = 0;
              local_fd0 = error;
              std::__cxx11::string::string((string *)&local_fc8,"main",(allocator *)&reader);
              std::__cxx11::string::string
                        (local_fa8,"checkQueueInvariants",(allocator *)&local_13e0);
              std::__cxx11::string::string
                        (local_f88,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,&local_13e2);
              local_f68 = 0xaa;
              std::__cxx11::string::string
                        (local_f60,"  Queue invariant violated: dataEnd={} > capacity={}",
                         &local_13e1);
              cVar6 = binlog::detail::
                      concatenated_tags<char_const(&)[53],unsigned_long&,unsigned_long&>
                                ((char (*) [53])
                                 "  Queue invariant violated: dataEnd={} > capacity={}",&uStack_13a0
                                 ,&local_1398);
              size = CONCAT53(size._3_5_,cVar6._data);
              std::__cxx11::string::string(local_f40,(char *)&size,&local_13da);
              uVar14 = binlog::Session::addEventSource(pSVar1,(EventSource *)&offset);
              binlog::EventSource::~EventSource((EventSource *)&offset);
              LOCK();
              UNLOCK();
              _ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_0_0 =
                   uVar14;
            }
            uVar14 = 
            _ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_0_0;
            pSVar8 = binlog::default_thread_local_writer();
            nVar10 = binlog::clockSinceEpoch();
            binlog::SessionWriter::addEvent<unsigned_long&,unsigned_long&>
                      (pSVar8,uVar14,nVar10.__r,&uStack_13a0,&local_1398);
          }
        }
        else if (local_1398 < local_1388._M_i) {
          pSVar8 = binlog::default_thread_local_writer();
          if ((pSVar8->_session->_minSeverity)._M_i < 0x201) {
            if (_ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_1_0
                == 0) {
              pSVar8 = binlog::default_thread_local_writer();
              pSVar1 = pSVar8->_session;
              queueBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              queueBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT62(queueBuffer.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._2_6_,0x200);
              std::__cxx11::string::string
                        ((string *)
                         &queueBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,"main",(allocator *)&local_13e0)
              ;
              std::__cxx11::string::string(local_12c8,"checkQueueInvariants",&local_13e2);
              std::__cxx11::string::string
                        (local_12a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,&local_13e1);
              local_1288 = 0xb0;
              std::__cxx11::string::string
                        (local_1280,"  Queue invariant violated: reader={} > capacity={}",
                         &local_13da);
              size = local_1388._M_i;
              cVar6 = binlog::detail::
                      concatenated_tags<char_const(&)[52],unsigned_long,unsigned_long&>
                                ((char (*) [52])
                                 "  Queue invariant violated: reader={} > capacity={}",&size,
                                 &local_1398);
              reader._queue = (Queue *)CONCAT53(reader._queue._3_5_,cVar6._data);
              std::__cxx11::string::string(local_1260,(char *)&reader,&local_13d9);
              uVar14 = binlog::Session::addEventSource(pSVar1,(EventSource *)&queueBuffer);
              binlog::EventSource::~EventSource((EventSource *)&queueBuffer);
              LOCK();
              UNLOCK();
              _ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_1_0 =
                   uVar14;
            }
            uVar14 = 
            _ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_1_0;
            pSVar8 = binlog::default_thread_local_writer();
            nVar10 = binlog::clockSinceEpoch();
            size = local_1388._M_i;
            goto LAB_001041ab;
          }
        }
        else {
          pSVar8 = binlog::default_thread_local_writer();
          if ((pSVar8->_session->_minSeverity)._M_i < 0x81) {
            if (_ZZN12_GLOBAL__N_18readDataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0
                == 0) {
              pSVar8 = binlog::default_thread_local_writer();
              pSVar1 = pSVar8->_session;
              local_f20._0_8_ = 0;
              local_f20._8_2_ = info;
              std::__cxx11::string::string((string *)(local_f20 + 0x10),"main",(allocator *)&size);
              std::__cxx11::string::string(local_ef0,"readData",(allocator *)&reader);
              std::__cxx11::string::string
                        (local_ed0,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,(allocator *)&local_13e0);
              local_eb0 = 200;
              std::__cxx11::string::string
                        (local_ea8,
                         "  Queue state is valid: capacity={} windex={} rindex={} dataend={}",
                         &local_13e2);
              local_1240._0_8_ = session;
              offset = local_1388._M_i;
              cVar7 = binlog::detail::
                      concatenated_tags<char_const(&)[67],unsigned_long&,unsigned_long,unsigned_long,unsigned_long&>
                                ((char (*) [67])
                                 "  Queue state is valid: capacity={} windex={} rindex={} dataend={}"
                                 ,&local_1398,(unsigned_long *)local_1240,(unsigned_long *)&offset,
                                 &uStack_13a0);
              queueBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT35(queueBuffer.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._5_3_,cVar7._data);
              std::__cxx11::string::string(local_e88,(char *)&queueBuffer,&local_13e1);
              uVar14 = binlog::Session::addEventSource(pSVar1,(EventSource *)local_f20);
              binlog::EventSource::~EventSource((EventSource *)local_f20);
              LOCK();
              UNLOCK();
              _ZZN12_GLOBAL__N_18readDataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0 =
                   uVar14;
            }
            uVar14 = 
            _ZZN12_GLOBAL__N_18readDataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0;
            pSVar8 = binlog::default_thread_local_writer();
            nVar10 = binlog::clockSinceEpoch();
            local_1240._0_8_ = session;
            offset = local_1388._M_i;
            in_R9 = (EventSource *)&offset;
            binlog::SessionWriter::
            addEvent<unsigned_long&,unsigned_long,unsigned_long,unsigned_long&>
                      (pSVar8,uVar14,nVar10.__r,&local_1398,(unsigned_long *)local_1240,
                       (unsigned_long *)&offset,&uStack_13a0);
          }
          anon_unknown.dwarf_111fd::printLogs();
          uVar4 = local_1398;
          sVar15 = anon_unknown.dwarf_111fd::remainingSize((istream *)&input);
          if (sVar15 < uVar4) {
            pSVar8 = binlog::default_thread_local_writer();
            if ((pSVar8->_session->_minSeverity)._M_i < 0x201) {
              if (_ZZN12_GLOBAL__N_18readDataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0_0
                  == 0) {
                pSVar8 = binlog::default_thread_local_writer();
                pSVar1 = pSVar8->_session;
                local_1090._0_8_ = 0;
                local_1090._8_2_ = 0x200;
                std::__cxx11::string::string((string *)local_1080,"main",(allocator *)&offset);
                std::__cxx11::string::string(local_1060,"readData",(allocator *)&queueBuffer);
                std::__cxx11::string::string
                          (local_1040,
                           "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                           ,(allocator *)&size);
                local_1020 = 0xcd;
                std::__cxx11::string::string
                          (local_1018,"  Input doesn\'t have {} bytes",(allocator *)&reader);
                local_1240._0_2_ = 0x4c;
                std::__cxx11::string::string(local_1178,(char *)local_1240,(allocator *)&local_13e0)
                ;
                uVar14 = binlog::Session::addEventSource(pSVar1,(EventSource *)local_1090);
                binlog::EventSource::~EventSource((EventSource *)local_1090);
                LOCK();
                UNLOCK();
                _ZZN12_GLOBAL__N_18readDataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0_0
                     = uVar14;
              }
              uVar14 = 
              _ZZN12_GLOBAL__N_18readDataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0_0;
              pSVar8 = binlog::default_thread_local_writer();
              nVar10 = binlog::clockSinceEpoch();
              binlog::SessionWriter::addEvent<unsigned_long&>(pSVar8,uVar14,nVar10.__r,&local_1398);
            }
            anon_unknown.dwarf_111fd::printLogs();
          }
          else {
            queueBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            queueBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            queueBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<char,_std::allocator<char>_>::resize(&queueBuffer,local_1398);
            std::istream::read((char *)&input,
                               (long)queueBuffer.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
            if ((abStack_418[*(long *)(_input + -0x18)] & 5) == 0) {
              pcStack_1390 = queueBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start;
              reader._queue = (Queue *)&session;
              reader._readEnd = 0;
              binlog::detail::QueueReader::beginRead((ReadResult *)&offset,&reader);
              local_13c8 = (pointer)0x0;
              size = 0;
              cStack_13d0._M_current = (char *)0x0;
              std::vector<char,_std::allocator<char>_>::reserve
                        ((vector<char,_std::allocator<char>_> *)&size,
                         local_fc0 + CONCAT62(uStack_fce,local_fd0));
              std::vector<char,std::allocator<char>>::insert<char_const*,void>
                        ((vector<char,std::allocator<char>> *)&size,cStack_13d0,(char *)offset,
                         (char *)(CONCAT62(uStack_fce,local_fd0) + offset));
              std::vector<char,std::allocator<char>>::insert<char_const*,void>
                        ((vector<char,std::allocator<char>> *)&size,cStack_13d0,local_fc8._M_p,
                         local_fc8._M_p + local_fc0);
              bVar5 = anon_unknown.dwarf_111fd::checkEntryBuffer
                                ((vector<char,_std::allocator<char>_> *)&size);
              if (bVar5) {
                pSVar8 = binlog::default_thread_local_writer();
                if ((pSVar8->_session->_minSeverity)._M_i < 0x81) {
                  if (_ZZN12_GLOBAL__N_18readDataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_2_0
                      == 0) {
                    pSVar8 = binlog::default_thread_local_writer();
                    pSVar1 = pSVar8->_session;
                    sessionptr = (void *)0x0;
                    local_e40 = info;
                    std::__cxx11::string::string(local_e38,"main",&local_13e2);
                    std::__cxx11::string::string(local_e18,"readData",&local_13e1);
                    std::__cxx11::string::string
                              (local_df8,
                               "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                               ,&local_13da);
                    local_dd8 = 0xeb;
                    std::__cxx11::string::string
                              (local_dd0,"  Recovered {} bytes of data from session={}",&local_13d9)
                    ;
                    local_1240._0_8_ = (long)cStack_13d0._M_current - size;
                    cVar6 = binlog::detail::
                            concatenated_tags<char_const(&)[45],unsigned_long,unsigned_long_const&>
                                      ((char (*) [45])"  Recovered {} bytes of data from session={}"
                                       ,(unsigned_long *)local_1240,&session_1);
                    local_13e0 = cVar6._data._0_2_;
                    local_13de = cVar6._data[2];
                    std::__cxx11::string::string(local_1180,(char *)&local_13e0,&local_1369);
                    uVar14 = binlog::Session::addEventSource(pSVar1,(EventSource *)&sessionptr);
                    binlog::EventSource::~EventSource((EventSource *)&sessionptr);
                    LOCK();
                    UNLOCK();
                    _ZZN12_GLOBAL__N_18readDataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_2_0
                         = uVar14;
                  }
                  uVar14 = 
                  _ZZN12_GLOBAL__N_18readDataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_2_0
                  ;
                  pSVar8 = binlog::default_thread_local_writer();
                  nVar10 = binlog::clockSinceEpoch();
                  local_1240._0_8_ = (long)cStack_13d0._M_current - size;
                  binlog::SessionWriter::addEvent<unsigned_long,unsigned_long_const&>
                            (pSVar8,uVar14,nVar10.__r,(unsigned_long *)local_1240,&session_1);
                }
                anon_unknown.dwarf_111fd::printLogs();
                local_1240._0_4_ = 1;
                local_1240._8_8_ = session_1;
                local_1230._0_8_ = size;
                local_1230._8_8_ = cStack_13d0._M_current;
                local_1230._16_8_ = local_13c8;
                size = 0;
                cStack_13d0._M_current = (char *)0x0;
                local_13c8 = (pointer)0x0;
                std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::
                emplace_back<RecoveredBuffer>(&buffers,(RecoveredBuffer *)local_1240);
                std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                          ((_Vector_base<char,_std::allocator<char>_> *)local_1230);
              }
              std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                        ((_Vector_base<char,_std::allocator<char>_> *)&size);
              std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                        (&queueBuffer.super__Vector_base<char,_std::allocator<char>_>);
              if (bVar5) goto LAB_00103bb0;
            }
            else {
              std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                        (&queueBuffer.super__Vector_base<char,_std::allocator<char>_>);
            }
          }
        }
        pSVar8 = binlog::default_thread_local_writer();
        if ((pSVar8->_session->_minSeverity)._M_i < 0x201) {
          if (main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i == 0) {
            pSVar8 = binlog::default_thread_local_writer();
            pSVar1 = pSVar8->_session;
            local_cd8._0_8_ = 0;
            local_cd8._8_2_ = error;
            std::__cxx11::string::string((string *)(local_cd8 + 0x10),"main",(allocator *)&offset);
            std::__cxx11::string::string(local_ca8,"main",(allocator *)&queueBuffer);
            std::__cxx11::string::string
                      (local_c88,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,(allocator *)local_f20);
            local_c68 = 0x12f;
            std::__cxx11::string::string
                      (local_c60,"  Failed to read data, continue searching at tellg={}",
                       (allocator *)local_1090);
            local_1240._0_2_ = 0x6c;
            std::__cxx11::string::string(local_1170,(char *)local_1240,(allocator *)&metadata);
            _Var9._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_cd8);
            binlog::EventSource::~EventSource((EventSource *)local_cd8);
            LOCK();
            UNLOCK();
            main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var9._M_i;
          }
          aVar3.super___atomic_base<unsigned_long>._M_i =
               main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i;
          pSVar8 = binlog::default_thread_local_writer();
          nVar10 = binlog::clockSinceEpoch();
          binlog::SessionWriter::addEvent<long_const&>
                    (pSVar8,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,nVar10.__r,
                     &afterMagicPos);
        }
        anon_unknown.dwarf_111fd::printLogs();
        goto LAB_001052b3;
      }
      std::istream::seekg((long)&input,0xfffffff9);
    } while( true );
  }
  pSVar8 = binlog::default_thread_local_writer();
  if ((pSVar8->_session->_minSeverity)._M_i < 0x201) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar8 = binlog::default_thread_local_writer();
      pSVar1 = pSVar8->_session;
      local_5a8._0_8_ = 0;
      local_5a8._8_2_ = error;
      std::__cxx11::string::string((string *)(local_5a8 + 0x10),"main",(allocator *)&offset);
      std::__cxx11::string::string(local_578,"main",(allocator *)&queueBuffer);
      std::__cxx11::string::string
                (local_558,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                 ,(allocator *)local_f20);
      local_538 = 0x108;
      std::__cxx11::string::string
                (local_530,"Failed to open {} for writing",(allocator *)local_1090);
      cVar6 = binlog::detail::concatenated_tags<char_const(&)[30],char_const*&>
                        ((char (*) [30])"Failed to open {} for writing",argv + 2);
      local_1240[0] = cVar6._data[0];
      local_1240[1] = cVar6._data[1];
      local_1240[2] = cVar6._data[2];
      std::__cxx11::string::string(local_510,local_1240,(allocator *)&metadata);
      _Var9._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_5a8);
      binlog::EventSource::~EventSource((EventSource *)local_5a8);
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var9._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    pSVar8 = binlog::default_thread_local_writer();
    nVar10 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<char_const*&>
              (pSVar8,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,nVar10.__r,argv + 2);
  }
  anon_unknown.dwarf_111fd::printLogs();
  anon_unknown.dwarf_111fd::showHelp();
  iVar17 = 3;
LAB_00105b4e:
  std::ofstream::~ofstream(&outputFile);
  std::__cxx11::string::~string((string *)&outputPath);
LAB_00105b68:
  std::ifstream::~ifstream(&input);
  return iVar17;
LAB_001052e0:
  if ((abStack_418[*(long *)(_input + -0x18)] & 2) == 0) {
    pSVar8 = binlog::default_thread_local_writer();
    if ((pSVar8->_session->_minSeverity)._M_i < 0x201) {
      if (main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i == 0) {
        pSVar8 = binlog::default_thread_local_writer();
        pSVar1 = pSVar8->_session;
        local_718._0_8_ = 0;
        local_718._8_2_ = error;
        std::__cxx11::string::string((string *)(local_718 + 0x10),"main",(allocator *)local_1240);
        std::__cxx11::string::string(local_6e8,"main",(allocator *)&offset);
        std::__cxx11::string::string
                  (local_6c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,(allocator *)&queueBuffer);
        local_6a8 = 0x141;
        std::__cxx11::string::string
                  (local_6a0,"Failure while reading input, continue anyway",(allocator *)local_f20);
        local_1090._0_8_ = local_1090._0_8_ & 0xffffffffffffff00;
        std::__cxx11::string::string(local_680,local_1090,(allocator *)&metadata);
        _Var9._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_718);
        binlog::EventSource::~EventSource((EventSource *)local_718);
        LOCK();
        UNLOCK();
        main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var9._M_i;
      }
      _Var9 = main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i;
      pSVar8 = binlog::default_thread_local_writer();
      nVar10 = binlog::clockSinceEpoch();
LAB_0010552d:
      binlog::SessionWriter::addEvent<>(pSVar8,_Var9._M_i,nVar10.__r);
    }
  }
  else {
    pSVar8 = binlog::default_thread_local_writer();
    if ((pSVar8->_session->_minSeverity)._M_i < 0x81) {
      if (main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i == 0) {
        pSVar8 = binlog::default_thread_local_writer();
        pSVar1 = pSVar8->_session;
        local_660._0_8_ = 0;
        local_660._8_2_ = info;
        std::__cxx11::string::string((string *)(local_660 + 0x10),"main",(allocator *)local_1240);
        std::__cxx11::string::string(local_630,"main",(allocator *)&offset);
        std::__cxx11::string::string
                  (local_610,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,(allocator *)&queueBuffer);
        local_5f0 = 0x13d;
        std::__cxx11::string::string(local_5e8,"Done reading input",(allocator *)local_f20);
        local_1090._0_8_ = local_1090._0_8_ & 0xffffffffffffff00;
        std::__cxx11::string::string(local_5c8,local_1090,(allocator *)&metadata);
        _Var9._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_660);
        binlog::EventSource::~EventSource((EventSource *)local_660);
        LOCK();
        UNLOCK();
        main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var9._M_i;
      }
      _Var9 = main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i;
      pSVar8 = binlog::default_thread_local_writer();
      nVar10 = binlog::clockSinceEpoch();
      goto LAB_0010552d;
    }
  }
  anon_unknown.dwarf_111fd::printLogs();
  pSVar8 = binlog::default_thread_local_writer();
  if ((pSVar8->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar8 = binlog::default_thread_local_writer();
      pSVar1 = pSVar8->_session;
      local_7d0._0_8_ = 0;
      local_7d0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_7d0 + 0x10),"main",(allocator *)local_1240);
      std::__cxx11::string::string(local_7a0,"main",(allocator *)&offset);
      std::__cxx11::string::string
                (local_780,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                 ,(allocator *)&queueBuffer);
      local_760 = 0x144;
      std::__cxx11::string::string(local_758,"Write output",(allocator *)local_f20);
      local_1090._0_8_ = local_1090._0_8_ & 0xffffffffffffff00;
      std::__cxx11::string::string(local_738,local_1090,(allocator *)&metadata);
      _Var9._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_7d0);
      binlog::EventSource::~EventSource((EventSource *)local_7d0);
      LOCK();
      UNLOCK();
      main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var9._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i;
    pSVar8 = binlog::default_thread_local_writer();
    nVar10 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar8,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,nVar10.__r);
  }
  anon_unknown.dwarf_111fd::printLogs();
  pRVar20 = buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pRVar18 = buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
      super__Vector_impl_data._M_start !=
      buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar21 = (long)buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar16 = lVar21 / 0x28;
    lVar2 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<RecoveredBuffer*,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
              (buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl
               .super__Vector_impl_data._M_start,
               buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl
               .super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar21 < 0x281) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<RecoveredBuffer*,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (pRVar18,pRVar20);
    }
    else {
      pRVar22 = pRVar18 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<RecoveredBuffer*,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (pRVar18,pRVar22);
      for (; pRVar22 != pRVar20; pRVar22 = pRVar22 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<RecoveredBuffer*,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>>,__gnu_cxx::__ops::_Val_comp_iter<main::__0>>
                  (pRVar22);
      }
    }
  }
  offset = 0;
  local_1358 = buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl
               .super__Vector_impl_data._M_finish;
  pRVar18 = buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pRVar20 = buffers.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (pRVar20 == pRVar18) {
      pSVar8 = binlog::default_thread_local_writer();
      if ((pSVar8->_session->_minSeverity)._M_i < 0x81) {
        if (main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i == 0) {
          pSVar8 = binlog::default_thread_local_writer();
          pSVar1 = pSVar8->_session;
          local_940._0_8_ = 0;
          local_940._8_2_ = info;
          std::__cxx11::string::string((string *)(local_940 + 0x10),"main",(allocator *)local_1240);
          std::__cxx11::string::string(local_910,"main",(allocator *)&queueBuffer);
          std::__cxx11::string::string
                    (local_8f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                     ,(allocator *)local_f20);
          local_8d0 = 0x15c;
          std::__cxx11::string::string(local_8c8,"Done writing output",(allocator *)local_1090);
          metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)((ulong)metadata.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00)
          ;
          std::__cxx11::string::string(local_8a8,(char *)&metadata,(allocator *)&sessionptr);
          _Var9._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_940);
          binlog::EventSource::~EventSource((EventSource *)local_940);
          LOCK();
          UNLOCK();
          main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var9._M_i;
        }
        aVar3.super___atomic_base<unsigned_long>._M_i =
             main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i;
        pSVar8 = binlog::default_thread_local_writer();
        nVar10 = binlog::clockSinceEpoch();
        binlog::SessionWriter::addEvent<>
                  (pSVar8,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,nVar10.__r);
      }
      iVar17 = 0;
      anon_unknown.dwarf_111fd::printLogs();
      goto LAB_00105b41;
    }
    pSVar8 = binlog::default_thread_local_writer();
    if ((pSVar8->_session->_minSeverity)._M_i < 0x81) {
      if (main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i == 0) {
        pSVar8 = binlog::default_thread_local_writer();
        pSVar1 = pSVar8->_session;
        local_d90._0_8_ = 0;
        local_d90._8_2_ = info;
        std::__cxx11::string::string((string *)(local_d90 + 0x10),"main",(allocator *)local_f20);
        std::__cxx11::string::string(local_d60,"main",(allocator *)local_1090);
        std::__cxx11::string::string
                  (local_d40,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,(allocator *)&metadata);
        local_d20 = 0x150;
        std::__cxx11::string::string
                  (local_d18,"Write {} bytes of recovered {} to output at offset {}",
                   (allocator *)&sessionptr);
        queueBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pRVar20->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish +
                   -(long)(pRVar20->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
        binlog::detail::
        concatenated_tags<char_const(&)[54],unsigned_long,BufferType_const&,unsigned_long&>
                  ((cx_string<35UL> *)local_1240,
                   (detail *)"Write {} bytes of recovered {} to output at offset {}",
                   (char (*) [54])&queueBuffer,(unsigned_long *)pRVar20,(BufferType *)&offset,
                   &in_R9->id);
        std::__cxx11::string::string(local_cf8,(char *)local_1240,(allocator *)&session);
        _Var9._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_d90);
        binlog::EventSource::~EventSource((EventSource *)local_d90);
        LOCK();
        UNLOCK();
        main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var9._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i;
      pSVar8 = binlog::default_thread_local_writer();
      nVar10 = binlog::clockSinceEpoch();
      local_1240._0_8_ =
           (long)(pRVar20->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pRVar20->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      in_R9 = (EventSource *)&offset;
      binlog::SessionWriter::addEvent<unsigned_long,BufferType_const&,unsigned_long&>
                (pSVar8,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,nVar10.__r,
                 (unsigned_long *)local_1240,&pRVar20->type,(unsigned_long *)in_R9);
      pRVar18 = local_1358;
    }
    anon_unknown.dwarf_111fd::printLogs();
    std::ostream::write((char *)this,
                        (long)(pRVar20->buffer).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    offset = (size_t)((pRVar20->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                     (offset - (long)(pRVar20->buffer).
                                     super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_start));
    pRVar20 = pRVar20 + 1;
  } while (((byte)pcVar11[*(long *)(*(long *)this + -0x18)] & 5) == 0);
  pSVar8 = binlog::default_thread_local_writer();
  if ((pSVar8->_session->_minSeverity)._M_i < 0x201) {
    if (main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar8 = binlog::default_thread_local_writer();
      pSVar1 = pSVar8->_session;
      local_888._0_8_ = 0;
      local_888._8_2_ = error;
      std::__cxx11::string::string((string *)(local_888 + 0x10),"main",(allocator *)local_1240);
      std::__cxx11::string::string(local_858,"main",(allocator *)&queueBuffer);
      std::__cxx11::string::string
                (local_838,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                 ,(allocator *)local_f20);
      local_818 = 0x156;
      std::__cxx11::string::string(local_810,"Failure while writing output",(allocator *)local_1090)
      ;
      metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start & 0xffffffffffffff00);
      std::__cxx11::string::string(local_7f0,(char *)&metadata,(allocator *)&sessionptr);
      _Var9._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_888);
      binlog::EventSource::~EventSource((EventSource *)local_888);
      LOCK();
      UNLOCK();
      main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var9._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i;
    pSVar8 = binlog::default_thread_local_writer();
    nVar10 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar8,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,nVar10.__r);
  }
  anon_unknown.dwarf_111fd::printLogs();
  iVar17 = 4;
LAB_00105b41:
  std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::~vector(&buffers);
  goto LAB_00105b4e;
}

Assistant:

int main(int argc, const char* argv[])
{
  if (argc < 2)
  {
    showHelp();
    return 1;
  }

  std::ifstream input(argv[1], std::ios_base::in|std::ios_base::binary);
  if (! input)
  {
    STDERR_ERROR("Failed to open {} for reading", argv[1]);
    showHelp();
    return 2;
  }

  const std::string outputPath = (argc > 2) ? argv[2] : "-";
  std::ofstream outputFile;
  std::ostream& output = openFile(outputPath, outputFile);
  if (! output)
  {
    STDERR_ERROR("Failed to open {} for writing", argv[2]);
    showHelp();
    return 3;
  }

  std::vector<RecoveredBuffer> buffers;

  // do not initialize arrays directly to remain endianness agnostic
  const std::array<unsigned char, 8> metadataMagic = toArray(0xFE214F726E35BDBC);
  const std::array<unsigned char, 8> dataMagic = toArray(0xFE213F716D34BCBC);

  // magic numbers start with the same byte, makes searching easier
  assert(metadataMagic[0] == dataMagic[0]);
  const unsigned char firstMagicByte = metadataMagic[0];

  STDERR_INFO("Read input from {}", argv[1]);

  while (input.ignore(std::numeric_limits<std::streamsize>::max(), firstMagicByte).good())
  {
    std::array<unsigned char, 8> magic{firstMagicByte, 0, 0, 0, 0, 0, 0, 0};
    input.read(reinterpret_cast<char*>(magic.data()+1), 7);

    const auto afterMagicPos = std::streamoff{input.tellg()};

    if (magic == metadataMagic)
    {
      STDERR_INFO("Magic number found, read metadata at tellg={}", afterMagicPos);
      if (! readMetadata(input, buffers))
      {
        STDERR_ERROR("  Failed to read metadata, continue searching at tellg={}", afterMagicPos);
        input.clear();
        input.seekg(afterMagicPos);
      }
    }
    else if (magic == dataMagic)
    {
      STDERR_INFO("Magic number found, read data at tellg={}", afterMagicPos);
      if (! readData(input, buffers))
      {
        STDERR_ERROR("  Failed to read data, continue searching at tellg={}", afterMagicPos);
        input.clear();
        input.seekg(afterMagicPos);
      }
    }
    else
    {
      // not a magic number, seek back
      input.seekg(-7, std::ios_base::cur);
    }
  }

  if (input.eof())
  {
    STDERR_INFO("Done reading input");
  }
  else
  {
    STDERR_ERROR("Failure while reading input, continue anyway");
  }

  STDERR_INFO("Write output");

  // make sure metadata precedes data, and everything is grouped by sessions
  const auto cmp = [](auto&& a, auto&& b)
  {
    return a.session == b.session ? a.type < b.type : a.session < b.session;
  };
  std::sort(buffers.begin(), buffers.end(), cmp);

  std::size_t offset = 0;
  for (const RecoveredBuffer& buffer : buffers)
  {
    STDERR_INFO("Write {} bytes of recovered {} to output at offset {}", buffer.buffer.size(), buffer.type, offset);
    output.write(buffer.buffer.data(), std::streamsize(buffer.buffer.size()));
    offset += buffer.buffer.size();

    if (! output)
    {
      STDERR_ERROR("Failure while writing output");
      return 4;

    }
  }

  STDERR_INFO("Done writing output");

  return 0;
}